

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingImageArrayTest::releaseResource(BindingImageArrayTest *this)

{
  uint local_4c;
  GLuint i;
  texture *textures [7];
  BindingImageArrayTest *this_local;
  
  textures[0] = &this->m_goku_01_texture;
  textures[1] = &this->m_goku_02_texture;
  textures[2] = &this->m_goku_03_texture;
  textures[3] = &this->m_goku_04_texture;
  textures[4] = &this->m_goku_05_texture;
  textures[5] = &this->m_goku_06_texture;
  textures[6] = (texture *)this;
  for (local_4c = 0; local_4c < 7; local_4c = local_4c + 1) {
    Utils::texture::release(textures[(ulong)local_4c - 1]);
  }
  return;
}

Assistant:

void BindingImageArrayTest::releaseResource()
{
	Utils::texture* textures[7] = {
		&m_goku_00_texture, &m_goku_01_texture, &m_goku_02_texture, &m_goku_03_texture,
		&m_goku_04_texture, &m_goku_05_texture, &m_goku_06_texture,
	};

	for (GLuint i = 0; i < 7; ++i)
	{
		textures[i]->release();
	}
}